

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::AddAutomaticSources(cmGlobalGenerator *this)

{
  bool bVar1;
  reference puVar2;
  pointer pcVar3;
  GeneratorTargetVector *pGVar4;
  reference this_00;
  pointer pcVar5;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  GeneratorTargetVector *__range2_2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg_3;
  iterator __end1_3;
  iterator __begin1_3;
  LocalGeneratorVector *__range1_3;
  string local_118;
  cmValue local_f8;
  reference local_f0;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  GeneratorTargetVector *__range2_1;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg_2;
  iterator __end1_2;
  iterator __begin1_2;
  LocalGeneratorVector *__range1_2;
  allocator<char> local_99;
  string local_98;
  cmValue local_78;
  reference local_70;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *gt;
  const_iterator __end2;
  const_iterator __begin2;
  GeneratorTargetVector *__range2;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg_1;
  iterator __end1_1;
  iterator __begin1_1;
  LocalGeneratorVector *__range1_1;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *lg;
  iterator __end1;
  iterator __begin1;
  LocalGeneratorVector *__range1;
  cmGlobalGenerator *this_local;
  
  __end1 = std::
           vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ::begin(&this->LocalGenerators);
  lg = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
       std::
       vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
       ::end(&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                                     *)&lg), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
             ::operator*(&__end1);
    pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (puVar2);
    cmLocalGenerator::CreateEvaluationFileOutputs(pcVar3);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::begin(&this->LocalGenerators);
  lg_1 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
         std::
         vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
         ::end(&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             *)&lg_1), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
             ::operator*(&__end1_1);
    pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (puVar2);
    pGVar4 = cmLocalGenerator::GetGeneratorTargets(pcVar3);
    __end2 = std::
             vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
             ::begin(pGVar4);
    gt = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
         std::
         vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
         ::end(pGVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                       *)&gt), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                 ::operator*(&__end2);
      pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(local_70);
      bVar1 = cmGeneratorTarget::CanCompileSources(pcVar5);
      if (bVar1) {
        pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                 operator->(puVar2);
        pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                           (local_70);
        cmLocalGenerator::AddUnityBuild(pcVar3,pcVar5);
        pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                 operator->(puVar2);
        pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                           (local_70);
        cmLocalGenerator::AddISPCDependencies(pcVar3,pcVar5);
        pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->(local_70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"PRECOMPILE_HEADERS_REUSE_FROM",&local_99);
        local_78 = cmGeneratorTarget::GetProperty(pcVar5,&local_98);
        bVar1 = cmValue::operator_cast_to_bool(&local_78);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                   operator->(puVar2);
          pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (local_70);
          cmLocalGenerator::AddPchDependencies(pcVar3,pcVar5);
        }
        pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                 operator->(puVar2);
        pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                           (local_70);
        (*pcVar3->_vptr_cmLocalGenerator[9])(pcVar3,pcVar5);
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::begin(&this->LocalGenerators);
  lg_2 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
         std::
         vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
         ::end(&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             *)&lg_2), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
             ::operator*(&__end1_2);
    pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (puVar2);
    pGVar4 = cmLocalGenerator::GetGeneratorTargets(pcVar3);
    __end2_1 = std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::begin(pGVar4);
    gt_1 = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
           std::
           vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ::end(pGVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                               *)&gt_1), bVar1) {
      local_f0 = __gnu_cxx::
                 __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                 ::operator*(&__end2_1);
      pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(local_f0);
      bVar1 = cmGeneratorTarget::CanCompileSources(pcVar5);
      if (bVar1) {
        pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->(local_f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"PRECOMPILE_HEADERS_REUSE_FROM",
                   (allocator<char> *)((long)&__range1_3 + 7));
        local_f8 = cmGeneratorTarget::GetProperty(pcVar5,&local_118);
        bVar1 = cmValue::operator_cast_to_bool(&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_3 + 7));
        if (bVar1) {
          pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                   operator->(puVar2);
          pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                             (local_f0);
          cmLocalGenerator::AddPchDependencies(pcVar3,pcVar5);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2_1);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::begin(&this->LocalGenerators);
  lg_3 = (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)
         std::
         vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
         ::end(&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
                             *)&lg_3), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
             ::operator*(&__end1_3);
    pcVar3 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                       (puVar2);
    pGVar4 = cmLocalGenerator::GetGeneratorTargets(pcVar3);
    __end2_2 = std::
               vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
               ::begin(pGVar4);
    gt_2 = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
           std::
           vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ::end(pGVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                               *)&gt_2), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                ::operator*(&__end2_2);
      pcVar5 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
               operator->(this_00);
      cmGeneratorTarget::ClearSourcesCache(pcVar5);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
      ::operator++(&__end2_2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_*,_std::vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>_>
    ::operator++(&__end1_3);
  }
  return true;
}

Assistant:

bool cmGlobalGenerator::AddAutomaticSources()
{
  for (const auto& lg : this->LocalGenerators) {
    lg->CreateEvaluationFileOutputs();
  }
  for (const auto& lg : this->LocalGenerators) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      if (!gt->CanCompileSources()) {
        continue;
      }
      lg->AddUnityBuild(gt.get());
      lg->AddISPCDependencies(gt.get());
      // Targets that re-use a PCH are handled below.
      if (!gt->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM")) {
        lg->AddPchDependencies(gt.get());
      }
      lg->AddXCConfigSources(gt.get());
    }
  }
  for (const auto& lg : this->LocalGenerators) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      if (!gt->CanCompileSources()) {
        continue;
      }
      // Handle targets that re-use a PCH from an above-handled target.
      if (gt->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM")) {
        lg->AddPchDependencies(gt.get());
      }
    }
  }
  // The above transformations may have changed the classification of sources.
  // Clear the source list and classification cache (KindedSources) of all
  // targets so that it will be recomputed correctly by the generators later
  // now that the above transformations are done for all targets.
  for (const auto& lg : this->LocalGenerators) {
    for (const auto& gt : lg->GetGeneratorTargets()) {
      gt->ClearSourcesCache();
    }
  }
  return true;
}